

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse3CachedNFA(int iters,char *regexp,StringPiece *text)

{
  Regexp *this;
  Prog *this_00;
  long lVar1;
  int iVar2;
  bool bVar3;
  StringPiece sp [4];
  LogMessageFatal local_1b0;
  
  StringPiece::StringPiece((StringPiece *)&local_1b0,regexp);
  this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x462);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: re");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  this_00 = Regexp::CompileToProg(this,0);
  if (this_00 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x464);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&sp[0].ptr_ + lVar1) = 0;
    *(undefined4 *)((long)&sp[0].length_ + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  iVar2 = 0;
  if (0 < iters) {
    iVar2 = iters;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_1b0.super_LogMessage._0_8_ = (char *)0x0;
    local_1b0.super_LogMessage._8_4_ = 0;
    bVar3 = Prog::SearchNFA(this_00,text,(StringPiece *)&local_1b0,kAnchored,kFullMatch,sp,4);
    if (!bVar3) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x467);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
  }
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
  }
  operator_delete(this_00);
  Regexp::Decref(this);
  return;
}

Assistant:

void Parse3CachedNFA(int iters, const char* regexp, const StringPiece& text) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  StringPiece sp[4];  // 4 because sp[0] is whole match.
  for (int i = 0; i < iters; i++) {
    CHECK(prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4));
  }
  delete prog;
  re->Decref();
}